

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryFile.hpp
# Opt level: O2

void __thiscall
supermap::io::TemporaryFile::TemporaryFile
          (TemporaryFile *this,path *path,shared_ptr<supermap::io::FileManager> *manager)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  std::__cxx11::string::string((string *)this,(string *)path);
  (this->manager_).super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (manager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var2 = (manager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (manager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->manager_).super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar1;
  (this->manager_).super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (manager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  this->canceledDeletion_ = false;
  FileManager::create((this->manager_).
                      super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,path);
  return;
}

Assistant:

explicit TemporaryFile(const std::filesystem::path &path, std::shared_ptr<FileManager> manager)
        : path_(path), manager_(std::move(manager)) {
        manager_->create(path);
    }